

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckedArithmetic.h
# Opt level: O0

uint Imf_3_3::uiMult<unsigned_int>(uint a,uint b)

{
  uint uVar1;
  char *text;
  uint in_ESI;
  uint in_EDI;
  StaticAssertionFailed<true> staticAssertionFailed;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (in_EDI != 0) {
    uVar2 = in_ESI;
    uVar1 = std::numeric_limits<unsigned_int>::max();
    if (uVar1 / in_EDI < uVar2) {
      text = (char *)__cxa_allocate_exception(0x48);
      Iex_3_3::OverflowExc::OverflowExc
                ((OverflowExc *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),text);
      __cxa_throw(text,&Iex_3_3::OverflowExc::typeinfo,Iex_3_3::OverflowExc::~OverflowExc);
    }
  }
  return in_EDI * in_ESI;
}

Assistant:

inline T
uiMult (T a, T b)
{
    //
    // Unsigned integer multiplication
    //

    IMF_STATIC_ASSERT (
        !std::numeric_limits<T>::is_signed &&
        std::numeric_limits<T>::is_integer);

    if (a > 0 && b > std::numeric_limits<T>::max () / a)
        throw IEX_NAMESPACE::OverflowExc ("Integer multiplication overflow.");

    return a * b;
}